

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::initCache(Cache *this)

{
  uint uVar1;
  pointer pBVar2;
  uint uVar3;
  allocator_type local_49;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)&local_48,
             (ulong)(this->policy).blockNum,&local_49);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::_M_move_assign(&this->blocks,&local_48);
  std::vector<Cache::Block,_std::allocator<Cache::Block>_>::~vector
            ((vector<Cache::Block,_std::allocator<Cache::Block>_> *)&local_48);
  uVar3 = 0;
  while( true ) {
    pBVar2 = (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->blocks).
                       super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pBVar2) / 0x30) <= (ulong)uVar3)
    break;
    pBVar2 = pBVar2 + uVar3;
    pBVar2->valid = false;
    pBVar2->modified = false;
    uVar1 = (this->policy).blockSize;
    pBVar2->size = uVar1;
    pBVar2->tag = 0;
    pBVar2->id = uVar3 / (this->policy).associativity;
    pBVar2->lastReference = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,(ulong)uVar1,
               (allocator_type *)&local_49);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&pBVar2->data,&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void Cache::initCache() {
  this->blocks = std::vector<Block>(policy.blockNum);
  for (uint32_t i = 0; i < this->blocks.size(); ++i) {
    Block &b = this->blocks[i];
    b.valid = false;
    b.modified = false;
    b.size = policy.blockSize;
    b.tag = 0;
    b.id = i / policy.associativity;
    b.lastReference = 0;
    b.data = std::vector<uint8_t>(b.size);
  }
}